

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::anon_unknown_0::HasField
          (anon_unknown_0 *this,Type *type,Cardinality cardinality,Kind kind,string_view name,
          int number)

{
  Field_Cardinality FVar1;
  Cardinality CVar2;
  int32_t iVar3;
  Field *this_00;
  undefined4 in_register_0000000c;
  string_view name_00;
  undefined1 local_51;
  Field *field;
  int number_local;
  Kind kind_local;
  Cardinality cardinality_local;
  Type *type_local;
  string_view name_local;
  
  name_00._M_str = (Type *)CONCAT44(in_register_0000000c,kind);
  name_00._M_len = name._M_len;
  this_00 = FindField(this,name_00._M_str,name_00);
  if (this_00 == (Field *)0x0) {
    name_local._M_str._7_1_ = false;
  }
  else {
    FVar1 = Field::cardinality(this_00);
    local_51 = false;
    if (FVar1 == (Field_Cardinality)type) {
      CVar2 = Field::kind(this_00);
      local_51 = false;
      if (CVar2 == cardinality) {
        iVar3 = Field::number(this_00);
        local_51 = iVar3 == (int)name._M_str;
      }
    }
    name_local._M_str._7_1_ = local_51;
  }
  return name_local._M_str._7_1_;
}

Assistant:

bool HasField(const Type& type, Field::Cardinality cardinality,
              Field::Kind kind, absl::string_view name, int number) {
  const Field* field = FindField(type, name);
  if (field == nullptr) {
    return false;
  }
  return field->cardinality() == cardinality && field->kind() == kind &&
         field->number() == number;
}